

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O0

void __thiscall
direct_solvers_lower_upper_factorise_solve_Test::~direct_solvers_lower_upper_factorise_solve_Test
          (direct_solvers_lower_upper_factorise_solve_Test *this)

{
  direct_solvers_lower_upper_factorise_solve_Test *this_local;
  
  ~direct_solvers_lower_upper_factorise_solve_Test(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorise_solve) {

  // Setup linear system (source https://lampx.tugraz.at/~hadley/num/ch2/2.3a.php)
  Matrix_Dense<Scalar, 0, 0> matrix = {{2, 7, 6}, {9, 5, 1}, {4, 3, 8}};
  Vector_Dense<Scalar, 0> b_vector = {6, 2, 7};
  Vector_Dense<Scalar, 0> x_vector = {0, 0, 0};
  Vector_Dense<Scalar, 0> solution = {0.04166666666666696, 0.16666666666666657, 0.7916666666666667};

  // Test LU
  EXPECT_TRUE(lu_solver.factorise(matrix));
  auto data = lu_solver.solve_system(x_vector, b_vector);
  EXPECT_TRUE(data.converged);
  EXPECT_EQ(data.iteration, 1);
  EXPECT_NEAR(solution[0], x_vector[0], default_absolute);
  EXPECT_NEAR(solution[1], x_vector[1], default_absolute);
  EXPECT_NEAR(solution[2], x_vector[2], default_absolute);

  // Test LUP
  x_vector = {0, 0, 0};
  EXPECT_TRUE(lup_solver.factorise(matrix));
  data = lup_solver.solve_system(x_vector, b_vector);
  EXPECT_TRUE(data.converged);
  EXPECT_EQ(data.iteration, 1);
  EXPECT_NEAR(solution[0], x_vector[0], default_absolute);
  EXPECT_NEAR(solution[1], x_vector[1], default_absolute);
  EXPECT_NEAR(solution[2], x_vector[2], default_absolute);
}